

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int pagerWalFrames(Pager *pPager,PgHdr *pList,Pgno nTruncate,int isCommit)

{
  byte bVar1;
  Wal *pWal;
  u32 *puVar2;
  _func_int_sqlite3_file_ptr *p_Var3;
  bool bVar4;
  Pager *pPVar5;
  u32 x_2;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint *p;
  uint uVar11;
  uint uVar12;
  PgHdr **ppPVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  PgHdr *pPVar17;
  long lVar18;
  sqlite3_backup *p_00;
  uint uVar19;
  PgHdr *pPVar20;
  u32 iFrame;
  long lVar21;
  bool bVar22;
  u32 salt1;
  WalWriter w;
  ulong local_c8;
  PgHdr *local_c0;
  ulong local_a8;
  uint local_a0 [2];
  undefined8 local_98;
  uint local_90;
  uint local_8c;
  PgHdr *local_80;
  long local_78;
  sqlite3_file *local_70;
  uint *local_68;
  long local_60;
  Pager *local_58;
  WalWriter local_50;
  
  local_80 = pList;
  if (isCommit == 0) {
    iVar6 = 1;
    pPVar20 = pList;
  }
  else if (pList == (PgHdr *)0x0) {
    iVar6 = 0;
    pPVar20 = (PgHdr *)0x0;
  }
  else {
    iVar6 = 0;
    ppPVar13 = &local_80;
    do {
      if (pList->pgno <= nTruncate) {
        ppPVar13 = &pList->pDirty;
      }
      iVar6 = iVar6 + (uint)(pList->pgno <= nTruncate);
      pList = pList->pDirty;
      *ppPVar13 = pList;
      pPVar20 = local_80;
    } while (pList != (PgHdr *)0x0);
  }
  pPager->aStat[2] = pPager->aStat[2] + iVar6;
  if (pPVar20->pgno == 1) {
    uVar11 = *(uint *)pPVar20->pPager->dbFileVers;
    uVar11 = (uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18) +
             1;
    uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 * 0x1000000
    ;
    *(uint *)((long)pPVar20->pData + 0x18) = uVar11;
    *(uint *)((long)pPVar20->pData + 0x5c) = uVar11;
    *(undefined4 *)((long)pPVar20->pData + 0x60) = 0x28092e00;
  }
  pWal = pPager->pWal;
  uVar11 = pPager->pageSize;
  bVar1 = pPager->walSyncFlags;
  uVar7 = (uint)bVar1;
  puVar2 = *pWal->apWiData;
  iVar6 = bcmp(&pWal->hdr,puVar2,0x30);
  local_58 = pPager;
  if (iVar6 == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = puVar2[4] + 1;
  }
  if (pWal->readLock == 0) {
    if (puVar2[0x18] == 0) {
LAB_00121990:
      if (pWal->exclusiveMode == '\0') {
        (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,5);
      }
      pWal->readLock = -1;
      iVar8 = 1;
      do {
        iVar6 = walTryBeginRead(pWal,(int *)&local_a8,1,iVar8);
        iVar8 = iVar8 + 1;
      } while (iVar6 == -1);
    }
    else {
      sqlite3_randomness(4,&local_a8);
      if (pWal->exclusiveMode != '\0') {
LAB_001216d7:
        walRestartHdr(pWal,(uint)local_a8);
        if (pWal->exclusiveMode == '\0') {
          (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,9);
        }
        goto LAB_00121990;
      }
      iVar6 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,4,4,10);
      if (iVar6 == 5) goto LAB_00121990;
      if (iVar6 == 0) goto LAB_001216d7;
    }
    if (iVar6 != 0) {
      return iVar6;
    }
  }
  uVar10 = (pWal->hdr).mxFrame;
  local_c8 = (ulong)uVar10;
  if (local_c8 == 0) {
    local_a8 = 0x18e22d0082067f37;
    local_a0[0] = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                  uVar11 << 0x18;
    uVar9 = pWal->nCkpt;
    local_a0[1] = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
    if (uVar9 == 0) {
      sqlite3_randomness(8,(pWal->hdr).aSalt);
    }
    local_98 = *(undefined8 *)(pWal->hdr).aSalt;
    uVar9 = 0;
    uVar15 = 0xfffffffffffffff8;
    uVar12 = 0;
    do {
      uVar12 = uVar12 + uVar9 + *(int *)((long)local_a0 + uVar15);
      uVar9 = uVar9 + *(int *)((long)local_a0 + uVar15 + 4) + uVar12;
      uVar15 = uVar15 + 8;
    } while (uVar15 < 0x10);
    local_90 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 |
               uVar12 * 0x1000000;
    local_8c = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 * 0x1000000;
    pWal->szPage = uVar11;
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).aFrameCksum[0] = uVar12;
    (pWal->hdr).aFrameCksum[1] = uVar9;
    pWal->truncateOnCommit = '\x01';
    iVar6 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x20,0);
    if (iVar6 != 0) {
      return iVar6;
    }
    if (((uVar7 != 0) && (pWal->syncHeader != '\0')) &&
       (iVar6 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,uVar7 & 0x13), iVar6 != 0)) {
      return iVar6;
    }
  }
  local_70 = pWal->pWalFd;
  local_50.iSyncPoint = 0;
  lVar14 = (long)(int)uVar11 + 0x18;
  lVar21 = local_c8 * lVar14 + 0x20;
  iVar6 = 0;
  local_50.pWal = pWal;
  local_50.pFd = local_70;
  local_50.syncFlags = uVar7;
  local_50.szPage = uVar11;
  if (pPVar20 == (PgHdr *)0x0) {
    local_c0 = (PgHdr *)0x0;
    local_c8._0_4_ = uVar10;
  }
  else {
    local_c0 = (PgHdr *)0x0;
    pPVar17 = pPVar20;
    do {
      if (uVar19 == 0) {
LAB_00121610:
        if (isCommit == 0) {
          uVar15 = 0;
        }
        else {
          uVar15 = 0;
          if (pPVar17->pDirty == (PgHdr *)0x0) {
            uVar15 = (ulong)nTruncate;
          }
        }
LAB_0012162a:
        iVar8 = walWriteOneFrame(&local_50,(PgHdr *)pPVar17->pData,pPVar17->pgno,uVar15);
        if (iVar8 != 0) {
          return iVar8;
        }
        local_c8 = (ulong)((int)local_c8 + 1);
        lVar21 = lVar21 + lVar14;
        *(byte *)&pPVar17->flags = (byte)pPVar17->flags | 0x40;
        local_c0 = pPVar17;
      }
      else {
        if ((isCommit != 0) && (uVar15 = (ulong)nTruncate, pPVar17->pDirty == (PgHdr *)0x0))
        goto LAB_0012162a;
        local_a8 = local_a8 & 0xffffffff00000000;
        sqlite3WalFindFrame(pWal,pPVar17->pgno,(u32 *)&local_a8);
        if ((uint)local_a8 < uVar19) goto LAB_00121610;
        if ((uint)local_a8 <= pWal->iReCksum - 1) {
          pWal->iReCksum = (uint)local_a8;
        }
        iVar8 = (*pWal->pWalFd->pMethods->xWrite)
                          (pWal->pWalFd,pPVar17->pData,uVar11,
                           (ulong)((uint)local_a8 - 1) * lVar14 + 0x38);
        if (iVar8 != 0) {
          return iVar8;
        }
        *(byte *)&pPVar17->flags = (byte)pPVar17->flags & 0xbf;
      }
      pPVar17 = pPVar17->pDirty;
    } while (pPVar17 != (PgHdr *)0x0);
  }
  uVar19 = 0;
  if (isCommit == 0) goto LAB_00121b2d;
  if (pWal->iReCksum != 0) {
    lVar18 = (long)(int)pWal->szPage + 0x18;
    iVar6 = (int)lVar18;
    p = (uint *)sqlite3_malloc(iVar6);
    if (p == (uint *)0x0) {
      return 7;
    }
    lVar16 = 0x18;
    if (pWal->iReCksum != 1) {
      lVar16 = (ulong)(pWal->iReCksum - 2) * lVar18 + 0x30;
    }
    local_78 = lVar21;
    iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,8,lVar16);
    uVar19 = *p;
    (pWal->hdr).aFrameCksum[0] =
         uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    uVar19 = p[1];
    (pWal->hdr).aFrameCksum[1] =
         uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 | uVar19 << 0x18;
    uVar19 = pWal->iReCksum;
    pWal->iReCksum = 0;
    if (uVar19 <= (uint)local_c8 && iVar8 == 0) {
      local_60 = (long)iVar6;
      local_68 = p + 6;
      do {
        lVar21 = (ulong)(uVar19 - 1) * local_60 + 0x20;
        iVar8 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,p,iVar6,lVar21);
        if (iVar8 != 0) {
          sqlite3_free(p);
          return iVar8;
        }
        uVar10 = *p;
        uVar9 = p[1];
        walEncodeFrame(pWal,uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                            uVar10 << 0x18,
                       uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                       uVar9 << 0x18,(u8 *)local_68,(u8 *)&local_a8);
        iVar8 = (*pWal->pWalFd->pMethods->xWrite)(pWal->pWalFd,&local_a8,0x18,lVar21);
      } while ((uVar19 + 1 <= (uint)local_c8) && (uVar19 = uVar19 + 1, iVar8 == 0));
    }
    sqlite3_free(p);
    lVar21 = local_78;
    if (iVar8 != 0) {
      return iVar8;
    }
  }
  uVar19 = 0;
  iVar6 = 0;
  if ((bVar1 & 0x20) != 0) {
    if (pWal->padToSectorBoundary == '\0') {
      uVar19 = 0;
    }
    else {
      p_Var3 = pWal->pWalFd->pMethods->xSectorSize;
      if (p_Var3 == (_func_int_sqlite3_file_ptr *)0x0) {
        uVar15 = 0x1000;
      }
      else {
        uVar10 = (*p_Var3)(pWal->pWalFd);
        uVar19 = 0x10000;
        if (uVar10 < 0x10000) {
          uVar19 = uVar10;
        }
        uVar15 = 0x200;
        if (0x1f < (int)uVar10) {
          uVar15 = (ulong)uVar19;
        }
      }
      lVar18 = uVar15 + lVar21 + -1;
      lVar18 = lVar18 - lVar18 % (long)uVar15;
      iVar6 = 0;
      uVar19 = 0;
      local_50.iSyncPoint = lVar18;
      if (lVar21 < lVar18) {
        uVar19 = 0;
        lVar16 = lVar21;
        do {
          iVar8 = walWriteOneFrame(&local_50,(PgHdr *)local_c0->pData,local_c0->pgno,
                                   (ulong)nTruncate);
          if (iVar8 != 0) {
            return iVar8;
          }
          lVar16 = lVar16 + lVar14;
          uVar19 = uVar19 + 1;
        } while (lVar16 < lVar18);
      }
      if (lVar18 != lVar21) goto LAB_00121af5;
    }
    iVar6 = (*local_70->pMethods->xSync)(local_70,uVar7 & 0x13);
  }
LAB_00121af5:
  if ((pWal->truncateOnCommit != '\0') && (lVar21 = pWal->mxWalSize, -1 < lVar21)) {
    lVar14 = (ulong)((uint)local_c8 + uVar19) * lVar14 + 0x20;
    if (lVar14 <= lVar21) {
      lVar14 = lVar21;
    }
    walLimitSize(pWal,lVar14);
    pWal->truncateOnCommit = '\0';
  }
LAB_00121b2d:
  iFrame = (pWal->hdr).mxFrame;
  pPVar17 = pPVar20;
  while ((pPVar17 != (PgHdr *)0x0 && (iVar6 == 0))) {
    iVar6 = 0;
    if ((pPVar17->flags & 0x40) != 0) {
      iFrame = iFrame + 1;
      iVar6 = walIndexAppend(pWal,iFrame,pPVar17->pgno);
    }
    pPVar17 = pPVar17->pDirty;
  }
  bVar22 = iVar6 == 0;
  if ((bVar22) && (0 < (int)uVar19)) {
    do {
      iFrame = iFrame + 1;
      iVar6 = walIndexAppend(pWal,iFrame,local_c0->pgno);
      bVar22 = iVar6 == 0;
      if (!bVar22) break;
      bVar4 = 1 < uVar19;
      uVar19 = uVar19 - 1;
    } while (bVar4);
  }
  if (bVar22) {
    (pWal->hdr).szPage = (ushort)(uVar11 >> 0x10) | (ushort)uVar11 & 0xff00;
    (pWal->hdr).mxFrame = iFrame;
    if (isCommit != 0) {
      puVar2 = &(pWal->hdr).iChange;
      *puVar2 = *puVar2 + 1;
      (pWal->hdr).nPage = nTruncate;
      walIndexWriteHdr(pWal);
      pWal->iCallback = iFrame;
    }
  }
  else if (iVar6 != 0) {
    return iVar6;
  }
  pPVar5 = local_58;
  p_00 = local_58->pBackup;
  if (p_00 != (sqlite3_backup *)0x0 && pPVar20 != (PgHdr *)0x0) {
    while( true ) {
      if (p_00 != (sqlite3_backup *)0x0) {
        backupUpdate(p_00,pPVar20->pgno,(u8 *)pPVar20->pData);
      }
      pPVar20 = pPVar20->pDirty;
      if (pPVar20 == (PgHdr *)0x0) break;
      p_00 = pPVar5->pBackup;
    }
  }
  return 0;
}

Assistant:

static int pagerWalFrames(
  Pager *pPager,                  /* Pager object */
  PgHdr *pList,                   /* List of frames to log */
  Pgno nTruncate,                 /* Database size after this commit */
  int isCommit                    /* True if this is a commit */
){
  int rc;                         /* Return code */
  int nList;                      /* Number of pages in pList */
  PgHdr *p;                       /* For looping over pages */

  assert( pPager->pWal );
  assert( pList );
#ifdef SQLITE_DEBUG
  /* Verify that the page list is in accending order */
  for(p=pList; p && p->pDirty; p=p->pDirty){
    assert( p->pgno < p->pDirty->pgno );
  }
#endif

  assert( pList->pDirty==0 || isCommit );
  if( isCommit ){
    /* If a WAL transaction is being committed, there is no point in writing
    ** any pages with page numbers greater than nTruncate into the WAL file.
    ** They will never be read by any client. So remove them from the pDirty
    ** list here. */
    PgHdr **ppNext = &pList;
    nList = 0;
    for(p=pList; (*ppNext = p)!=0; p=p->pDirty){
      if( p->pgno<=nTruncate ){
        ppNext = &p->pDirty;
        nList++;
      }
    }
    assert( pList );
  }else{
    nList = 1;
  }
  pPager->aStat[PAGER_STAT_WRITE] += nList;

  if( pList->pgno==1 ) pager_write_changecounter(pList);
  rc = sqlite3WalFrames(pPager->pWal, 
      pPager->pageSize, pList, nTruncate, isCommit, pPager->walSyncFlags
  );
  if( rc==SQLITE_OK && pPager->pBackup ){
    for(p=pList; p; p=p->pDirty){
      sqlite3BackupUpdate(pPager->pBackup, p->pgno, (u8 *)p->pData);
    }
  }

#ifdef SQLITE_CHECK_PAGES
  pList = sqlite3PcacheDirtyList(pPager->pPCache);
  for(p=pList; p; p=p->pDirty){
    pager_set_pagehash(p);
  }
#endif

  return rc;
}